

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  TestObject *pTVar1;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar2;
  unsigned_long uVar3;
  bool bVar4;
  pointer pTVar5;
  int line;
  long lVar6;
  unsigned_long uVar7;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  if (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_) {
    lVar6 = 0;
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      pTVar1 = (first->current).node_;
      if (*(TestObject **)(this + 8) == pTVar1) {
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_50,"count","expected.size()",&local_40,(unsigned_long *)&local_58);
        if (local_50[0] != (internal)0x0) goto LAB_001df85c;
        testing::Message::Message((Message *)&local_58);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xb1;
LAB_001df81e:
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
        }
LAB_001df85c:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      if (pTVar1 == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0xe7,
                      "const_iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator++() [T = (anonymous namespace)::TestObject]"
                     );
      }
      (first->current).node_ =
           (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      piVar2 = (last->current).list_;
      pTVar5 = std::
               reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
               ::operator->(first);
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"expected[count]","last->data",(int *)((long)&piVar2->first_ + lVar6),
                 &pTVar5->data);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xae;
        goto LAB_001df81e;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar6 = lVar6 + 4;
      uVar3 = uVar7 + 1;
      local_40 = uVar7;
    } while (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0xfe,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator==(const_iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }